

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeConstraintPS::execute
          (FreeConstraintPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *param_4,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  int iVar1;
  int iVar2;
  pointer pnVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  int32_t iVar5;
  cpp_dec_float<200U,_int,_void> *v;
  long lVar6;
  long lVar7;
  uint *puVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  uint *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  pointer pnVar13;
  long lVar14;
  byte bVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  slack;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar15 = 0;
  iVar1 = this->m_i;
  iVar2 = this->m_old_i;
  if (iVar1 != iVar2) {
    pnVar3 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (uint *)(pnVar3 + iVar1);
    puVar11 = (uint *)(pnVar3 + iVar2);
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar11 = *puVar8;
      puVar8 = puVar8 + 1;
      puVar11 = puVar11 + 1;
    }
    pnVar3[iVar2].m_backend.exp = pnVar3[iVar1].m_backend.exp;
    pnVar3[iVar2].m_backend.neg = pnVar3[iVar1].m_backend.neg;
    iVar5 = pnVar3[iVar1].m_backend.prec_elem;
    pnVar3[iVar2].m_backend.fpclass = pnVar3[iVar1].m_backend.fpclass;
    pnVar3[iVar2].m_backend.prec_elem = iVar5;
    iVar1 = this->m_i;
    pnVar3 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = this->m_old_i;
    puVar8 = (uint *)(pnVar3 + iVar1);
    puVar11 = (uint *)(pnVar3 + iVar2);
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar11 = *puVar8;
      puVar8 = puVar8 + 1;
      puVar11 = puVar11 + 1;
    }
    pnVar3[iVar2].m_backend.exp = pnVar3[iVar1].m_backend.exp;
    pnVar3[iVar2].m_backend.neg = pnVar3[iVar1].m_backend.neg;
    iVar5 = pnVar3[iVar1].m_backend.prec_elem;
    pnVar3[iVar2].m_backend.fpclass = pnVar3[iVar1].m_backend.fpclass;
    pnVar3[iVar2].m_backend.prec_elem = iVar5;
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_b8,0.0);
  if (0 < (this->m_row).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar14 = 0;
    lVar6 = 0;
    do {
      pNVar4 = (this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)
               ((long)(pNVar4->val).m_backend.data._M_elems + lVar14);
      pcVar12 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [*(int *)((long)(&pNVar4->val + 1) + lVar14)].m_backend;
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x1c;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems[0xe] = 0;
      local_138.data._M_elems[0xf] = 0;
      local_138.data._M_elems[0x10] = 0;
      local_138.data._M_elems[0x11] = 0;
      local_138.data._M_elems[0x12] = 0;
      local_138.data._M_elems[0x13] = 0;
      local_138.data._M_elems[0x14] = 0;
      local_138.data._M_elems[0x15] = 0;
      local_138.data._M_elems[0x16] = 0;
      local_138.data._M_elems[0x17] = 0;
      local_138.data._M_elems[0x18] = 0;
      local_138.data._M_elems[0x19] = 0;
      local_138.data._M_elems._104_5_ = 0;
      local_138.data._M_elems[0x1b]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      v = pcVar9;
      if ((&local_138 != pcVar12) && (v = pcVar12, pcVar9 != &local_138)) {
        pcVar12 = &local_138;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pcVar12->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar15 * -8 + 4);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar15 * -8 + 4);
        }
        local_138.exp = *(int *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar14);
        local_138.neg = *(bool *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar14 + 4);
        local_138._120_8_ = *(undefined8 *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar14 + 8);
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_138,v);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_b8,&local_138);
      lVar6 = lVar6 + 1;
      lVar14 = lVar14 + 0x84;
    } while (lVar6 < (this->m_row).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused);
  }
  iVar1 = this->m_i;
  pnVar3 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar9 = &local_b8;
  pnVar13 = pnVar3 + iVar1;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar13->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
    pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar15 * -8 + 4);
    pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
  }
  pnVar3[iVar1].m_backend.exp = local_b8.exp;
  pnVar3[iVar1].m_backend.neg = local_b8.neg;
  pnVar3[iVar1].m_backend.fpclass = local_b8.fpclass;
  pnVar3[iVar1].m_backend.prec_elem = local_b8.prec_elem;
  iVar1 = this->m_i;
  pnVar3 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar10 = &this->m_row_obj;
  pnVar13 = pnVar3 + iVar1;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar13->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
    pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar10 + (ulong)bVar15 * -8 + 4);
    pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
  }
  pnVar3[iVar1].m_backend.exp = (this->m_row_obj).m_backend.exp;
  pnVar3[iVar1].m_backend.neg = (this->m_row_obj).m_backend.neg;
  iVar5 = (this->m_row_obj).m_backend.prec_elem;
  pnVar3[iVar1].m_backend.fpclass = (this->m_row_obj).m_backend.fpclass;
  pnVar3[iVar1].m_backend.prec_elem = iVar5;
  rStatus->data[this->m_i] = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::FreeConstraintPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // primal:
   R slack = 0.0;

   for(int k = 0; k < m_row.size(); ++k)
      slack += m_row.value(k) * x[m_row.index(k)];

   s[m_i] = slack;

   // dual:
   y[m_i] = m_row_obj;

   // basis:
   rStatus[m_i] = SPxSolverBase<R>::BASIC;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM15 Dimension doesn't match after this step.");
   }

#endif
}